

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

string * __thiscall
Catch::StringMaker<wchar_t_const*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<wchar_t_const*,void> *this,wchar_t *str)

{
  size_t sVar1;
  wstring local_40;
  
  if (this == (StringMaker<wchar_t_const*,void> *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"{null string}","");
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = wcslen((wchar_t *)this);
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_40,this,this + sVar1 * 4);
    StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
    ::convert(__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<wchar_t const*>::convert(wchar_t const * str) {
    if (str) {
        return ::Catch::Detail::stringify(std::wstring{ str });
    } else {
        return{ "{null string}" };
    }
}